

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_method.h
# Opt level: O3

duk_ret_t dukglue::detail::MethodInfo<false,_B,_const_char_*>::MethodRuntime::call_native_method
                    (duk_context *ctx)

{
  void *pvVar1;
  ulong *puVar2;
  code *pcVar3;
  char *pcVar4;
  duk_int_t line;
  duk_errcode_t err_code;
  
  duk_push_this(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_ce87);
  pvVar1 = duk_get_pointer(ctx,-1);
  if (pvVar1 == (void *)0x0) {
    pcVar4 = "Invalid native object for \'this\'";
    err_code = -4;
    line = 0x5b;
  }
  else {
    duk_pop_2(ctx);
    duk_push_current_function(ctx);
    duk_get_prop_string(ctx,-1,anon_var_dwarf_f4a1);
    puVar2 = (ulong *)duk_require_pointer(ctx,-1);
    if (puVar2 != (ulong *)0x0) {
      duk_pop_2(ctx);
      pcVar3 = (code *)*puVar2;
      if (((ulong)pcVar3 & 1) != 0) {
        pcVar3 = *(code **)(pcVar3 + *(long *)((long)pvVar1 + puVar2[1]) + -1);
      }
      pcVar4 = (char *)(*pcVar3)((long *)((long)pvVar1 + puVar2[1]));
      duk_push_string(ctx,pcVar4);
      return 1;
    }
    pcVar4 = "Method pointer missing?!";
    err_code = -6;
    line = 0x66;
  }
  duk_error_raw(ctx,err_code,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_method.h"
                ,line,pcVar4);
}

Assistant:

static duk_ret_t call_native_method(duk_context* ctx)
				{
					// get this.obj_ptr
					duk_push_this(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "obj_ptr");
					void* obj_void = duk_get_pointer(ctx, -1);
					if (obj_void == nullptr) {
						duk_error(ctx, DUK_RET_REFERENCE_ERROR, "Invalid native object for 'this'");
						return DUK_RET_REFERENCE_ERROR;
					}

					duk_pop_2(ctx); // pop this.obj_ptr and this

					// get current_function.method_info
					duk_push_current_function(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "method_holder");
					void* method_holder_void = duk_require_pointer(ctx, -1);
					if (method_holder_void == nullptr) {
						duk_error(ctx, DUK_RET_TYPE_ERROR, "Method pointer missing?!");
						return DUK_RET_TYPE_ERROR;
					}

					duk_pop_2(ctx);

					// (should always be valid unless someone is intentionally messing with this.obj_ptr...)
					Cls* obj = static_cast<Cls*>(obj_void);
					MethodHolder* method_holder = static_cast<MethodHolder*>(method_holder_void);

					// read arguments and call method
                    auto bakedArgs = dukglue::detail::get_stack_values<Ts...>(ctx);
					actually_call(ctx, method_holder->method, obj, bakedArgs);
					return std::is_void<RetType>::value ? 0 : 1;
				}